

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.h
# Opt level: O2

void __thiscall Memory::ReferencedArenaAdapter::DeleteArena(ReferencedArenaAdapter *this)

{
  bool bVar1;
  
  this->deleteFlag = true;
  bVar1 = CCLock::TryEnter(&(this->adapterLock).super_CCLock);
  if (bVar1) {
    if (this->strongRefCount == 0) {
      DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::ArenaAllocator>
                (&HeapAllocator::Instance,this->arena);
      this->arena = (ArenaAllocator *)0x0;
    }
    CCLock::Leave(&(this->adapterLock).super_CCLock);
    return;
  }
  return;
}

Assistant:

void DeleteArena()
    {
        deleteFlag = true;
        if (adapterLock.TryEnter())
        {
            if (0 == strongRefCount)
            {
                // All strong references are gone, delete the arena
                HeapDelete(this->arena);
                this->arena = NULL;
            }
            adapterLock.Leave();
        }
    }